

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

void doh_show(Curl_easy *data,dohentry *d)

{
  curl_trc_feat *pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  uchar *puVar7;
  dohentry *s;
  ulong uVar8;
  size_t maxlength;
  char buffer [128];
  char local_b8 [136];
  
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
    Curl_infof(data,"[DoH] TTL: %u seconds",(ulong)d->ttl);
  }
  if (0 < d->numaddr) {
    puVar7 = d->addr[0].ip.v4 + 1;
    lVar6 = 0;
    do {
      iVar2 = d->addr[lVar6].type;
      if (iVar2 == 0x1c) {
        iVar2 = curl_msnprintf(local_b8,0x80,"[DoH] AAAA: ");
        pcVar4 = local_b8 + iVar2;
        maxlength = 0x80 - (long)iVar2;
        uVar8 = 0xfffffffffffffffe;
        do {
          pcVar5 = ":";
          if (uVar8 == 0xfffffffffffffffe) {
            pcVar5 = "";
          }
          curl_msnprintf(pcVar4,maxlength,"%s%02x%02x",pcVar5,(ulong)puVar7[uVar8 + 1],
                         (ulong)puVar7[uVar8 + 2]);
          sVar3 = strlen(pcVar4);
          maxlength = maxlength - sVar3;
          pcVar4 = pcVar4 + sVar3;
          uVar8 = uVar8 + 2;
        } while (uVar8 < 0xe);
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))
           )) {
          Curl_infof(data,"%s",local_b8);
        }
      }
      else if (((iVar2 == 1) && (((data->set).field_0x8cd & 0x10) != 0)) &&
              ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
               (0 < pcVar1->log_level)))) {
        Curl_infof(data,"[DoH] A: %u.%u.%u.%u",(ulong)d->addr[lVar6].ip.v4[0],
                   (ulong)d->addr[lVar6].ip.v4[1],(ulong)d->addr[lVar6].ip.v4[2],
                   (ulong)d->addr[lVar6].ip.v4[3]);
      }
      lVar6 = lVar6 + 1;
      puVar7 = puVar7 + 0x14;
    } while (lVar6 < d->numaddr);
  }
  if (0 < d->numcname) {
    lVar6 = 0;
    s = d;
    do {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
      {
        pcVar4 = Curl_dyn_ptr(s->cname);
        Curl_infof(data,"CNAME: %s",pcVar4);
      }
      lVar6 = lVar6 + 1;
      s = (dohentry *)(s->cname + 1);
    } while (lVar6 < d->numcname);
  }
  return;
}

Assistant:

static void doh_show(struct Curl_easy *data,
                     const struct dohentry *d)
{
  int i;
  infof(data, "[DoH] TTL: %u seconds", d->ttl);
  for(i = 0; i < d->numaddr; i++) {
    const struct dohaddr *a = &d->addr[i];
    if(a->type == DNS_TYPE_A) {
      infof(data, "[DoH] A: %u.%u.%u.%u",
            a->ip.v4[0], a->ip.v4[1],
            a->ip.v4[2], a->ip.v4[3]);
    }
    else if(a->type == DNS_TYPE_AAAA) {
      int j;
      char buffer[128];
      char *ptr;
      size_t len;
      len = msnprintf(buffer, 128, "[DoH] AAAA: ");
      ptr = &buffer[len];
      len = sizeof(buffer) - len;
      for(j = 0; j < 16; j += 2) {
        size_t l;
        msnprintf(ptr, len, "%s%02x%02x", j ? ":" : "", d->addr[i].ip.v6[j],
                  d->addr[i].ip.v6[j + 1]);
        l = strlen(ptr);
        len -= l;
        ptr += l;
      }
      infof(data, "%s", buffer);
    }
  }
#ifdef USE_HTTPSRR
  for(i = 0; i < d->numhttps_rrs; i++) {
# ifdef DEBUGBUILD
    doh_print_buf(data, "DoH HTTPS",
                  d->https_rrs[i].val, d->https_rrs[i].len);
# else
    infof(data, "DoH HTTPS RR: length %d", d->https_rrs[i].len);
# endif
  }
#endif
  for(i = 0; i < d->numcname; i++) {
    infof(data, "CNAME: %s", Curl_dyn_ptr(&d->cname[i]));
  }
}